

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O2

void __thiscall xray_re::xr_memory_writer::xr_memory_writer(xr_memory_writer *this)

{
  xr_writer::xr_writer(&this->super_xr_writer);
  (this->super_xr_writer)._vptr_xr_writer = (_func_int **)&PTR__xr_memory_writer_0023a448;
  (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_pos = 0;
  return;
}

Assistant:

xr_memory_writer::xr_memory_writer(): m_pos(0) {}